

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O1

int lfreepool(lua_State *L)

{
  undefined8 *puVar1;
  size_t sVar2;
  buffer_node *node;
  uint uVar3;
  ulong uVar4;
  
  puVar1 = (undefined8 *)lua_touserdata(L,1);
  sVar2 = lua_rawlen(L,1);
  uVar3 = (uint)(sVar2 / 0x18);
  if (0 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    do {
      if ((void *)*puVar1 != (void *)0x0) {
        free((void *)*puVar1);
        *puVar1 = 0;
      }
      puVar1 = puVar1 + 3;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return 0;
}

Assistant:

static int
lfreepool(lua_State *L) {
	struct buffer_node * pool = lua_touserdata(L, 1);
	int sz = lua_rawlen(L,1) / sizeof(*pool);
	int i;
	for (i=0;i<sz;i++) {
		struct buffer_node *node = &pool[i];
		if (node->msg) {
			skynet_free(node->msg);
			node->msg = NULL;
		}
	}
	return 0;
}